

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O2

void ST_LoadCrosshair(bool alwaysload)

{
  undefined8 uVar1;
  uint uVar2;
  FTextureID FVar3;
  AActor *pAVar4;
  uint uVar5;
  char name [16];
  
  if ((((!crosshairforce.Value) &&
       (pAVar4 = GC::ReadBarrier<AActor>((AActor **)(&DAT_009ba598 + (long)consoleplayer * 0x54)),
       pAVar4 != (AActor *)0x0)) &&
      (pAVar4 = GC::ReadBarrier<AActor>((AActor **)(&DAT_009ba598 + (long)consoleplayer * 0x54)),
      pAVar4->player != (player_t *)0x0)) &&
     (pAVar4 = GC::ReadBarrier<AActor>((AActor **)(&DAT_009ba598 + (long)consoleplayer * 0x54)),
     pAVar4->player->ReadyWeapon != (AWeapon *)0x0)) {
    pAVar4 = GC::ReadBarrier<AActor>((AActor **)(&DAT_009ba598 + (long)consoleplayer * 0x54));
    uVar5 = pAVar4->player->ReadyWeapon->Crosshair;
    if (uVar5 != 0) goto LAB_0057a62e;
  }
  uVar5 = crosshair.Value;
LAB_0057a62e:
  if ((alwaysload) || (CrosshairNum != uVar5 || CrosshairImage == (FTexture *)0x0)) {
    if (CrosshairImage != (FTexture *)0x0) {
      (*CrosshairImage->_vptr_FTexture[9])();
    }
    if (uVar5 == 0) {
      CrosshairNum = 0;
    }
    else {
      uVar2 = -uVar5;
      if (0 < (int)uVar5) {
        uVar2 = uVar5;
      }
      uVar1 = 0x42;
      if ((screen->super_DSimpleCanvas).super_DCanvas.Width < 0x280) {
        uVar1 = 0x53;
      }
      mysnprintf(name,0x10,"XHAIR%c%d",uVar1,(ulong)uVar2);
      FVar3 = FTextureManager::CheckForTexture(&TexMan,name,8,0x11);
      if (FVar3.texnum < 1) {
        mysnprintf(name,0x10,"XHAIR%c1",uVar1);
        FVar3 = FTextureManager::CheckForTexture(&TexMan,name,8,0x11);
        if (FVar3.texnum < 1) {
          FVar3 = FTextureManager::CheckForTexture(&TexMan,"XHAIRS1",8,0x11);
        }
      }
      CrosshairNum = uVar2;
      if ((uint)FVar3.texnum < TexMan.Textures.Count) {
        CrosshairImage = TexMan.Textures.Array[FVar3.texnum].Texture;
        return;
      }
    }
    CrosshairImage = (FTexture *)0x0;
  }
  return;
}

Assistant:

void ST_LoadCrosshair(bool alwaysload)
{
	int num = 0;
	char name[16], size;

	if (!crosshairforce &&
		players[consoleplayer].camera != NULL &&
		players[consoleplayer].camera->player != NULL &&
		players[consoleplayer].camera->player->ReadyWeapon != NULL)
	{
		num = players[consoleplayer].camera->player->ReadyWeapon->Crosshair;
	}
	if (num == 0)
	{
		num = crosshair;
	}
	if (!alwaysload && CrosshairNum == num && CrosshairImage != NULL)
	{ // No change.
		return;
	}

	if (CrosshairImage != NULL)
	{
		CrosshairImage->Unload ();
	}
	if (num == 0)
	{
		CrosshairNum = 0;
		CrosshairImage = NULL;
		return;
	}
	if (num < 0)
	{
		num = -num;
	}
	size = (SCREENWIDTH < 640) ? 'S' : 'B';

	mysnprintf (name, countof(name), "XHAIR%c%d", size, num);
	FTextureID texid = TexMan.CheckForTexture(name, FTexture::TEX_MiscPatch, FTextureManager::TEXMAN_TryAny | FTextureManager::TEXMAN_ShortNameOnly);
	if (!texid.isValid())
	{
		mysnprintf (name, countof(name), "XHAIR%c1", size);
		texid = TexMan.CheckForTexture(name, FTexture::TEX_MiscPatch, FTextureManager::TEXMAN_TryAny | FTextureManager::TEXMAN_ShortNameOnly);
		if (!texid.isValid())
		{
			texid = TexMan.CheckForTexture("XHAIRS1", FTexture::TEX_MiscPatch, FTextureManager::TEXMAN_TryAny | FTextureManager::TEXMAN_ShortNameOnly);
		}
	}
	CrosshairNum = num;
	CrosshairImage = TexMan[texid];
}